

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall
pugi::xml_node::find_child_by_attribute
          (xml_node *this,char_t *name_,char_t *attr_name,char_t *attr_value)

{
  xml_node_struct *pxVar1;
  bool bVar2;
  xml_node_struct *in_RAX;
  char_t *dst;
  xml_attribute_struct *pxVar3;
  xml_node_struct *local_38;
  
  if (this->_root != (xml_node_struct *)0x0) {
    for (pxVar1 = this->_root->first_child; pxVar1 != (xml_node_struct *)0x0;
        pxVar1 = pxVar1->next_sibling) {
      local_38 = in_RAX;
      if ((pxVar1->name != (char_t *)0x0) &&
         (bVar2 = impl::anon_unknown_0::strequal(name_,pxVar1->name), bVar2)) {
        for (pxVar3 = pxVar1->first_attribute; local_38 = in_RAX,
            pxVar3 != (xml_attribute_struct *)0x0; pxVar3 = pxVar3->next_attribute) {
          if ((pxVar3->name != (char_t *)0x0) &&
             (bVar2 = impl::anon_unknown_0::strequal(attr_name,pxVar3->name), bVar2)) {
            dst = pxVar3->value;
            if (dst == (char_t *)0x0) {
              dst = "";
            }
            bVar2 = impl::anon_unknown_0::strequal(attr_value,dst);
            local_38 = pxVar1;
            if (bVar2) break;
          }
        }
        if (pxVar3 != (xml_attribute_struct *)0x0) {
          return (xml_node)local_38;
        }
      }
      in_RAX = local_38;
    }
  }
  return (xml_node)(xml_node_struct *)0x0;
}

Assistant:

PUGI__FN xml_node xml_node::find_child_by_attribute(const char_t* name_, const char_t* attr_name, const char_t* attr_value) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
			if (i->name && impl::strequal(name_, i->name))
			{
				for (xml_attribute_struct* a = i->first_attribute; a; a = a->next_attribute)
					if (a->name && impl::strequal(attr_name, a->name) && impl::strequal(attr_value, a->value ? a->value + 0 : PUGIXML_TEXT("")))
						return xml_node(i);
			}

		return xml_node();
	}